

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O1

void freeSignature2(signature2_t *sig,picnic_instance_t *params)

{
  proof2_t *ppVar1;
  ulong uVar2;
  long lVar3;
  
  if (sig != (signature2_t *)0x0) {
    free(sig->iSeedInfo);
    free(sig->cvInfo);
    if (params->num_rounds != 0) {
      lVar3 = 0x28;
      uVar2 = 0;
      do {
        ppVar1 = sig->proofs;
        if (ppVar1 != (proof2_t *)0x0) {
          free(*(void **)((long)ppVar1 + lVar3 + -0x28));
          free(*(void **)((long)ppVar1 + lVar3 + -0x10));
          free(*(void **)((long)ppVar1 + lVar3 + -8));
          free(*(void **)((long)ppVar1 + lVar3 + -0x18));
          free(*(void **)((long)&ppVar1->seedInfo + lVar3));
        }
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x38;
      } while (uVar2 < params->num_rounds);
    }
    free(sig->proofs);
    free(sig->challengeP);
    free(sig->challengeC);
    free(sig->challenge);
    return;
  }
  return;
}

Assistant:

void freeSignature2(signature2_t* sig, const picnic_instance_t* params) {
  if (sig) {
    free(sig->iSeedInfo);
    free(sig->cvInfo);
    for (size_t i = 0; i < params->num_rounds; i++) {
      freeProof2(&sig->proofs[i]);
    }
    free(sig->proofs);
    free(sig->challengeP);
    free(sig->challengeC);
    free(sig->challenge);
  }
}